

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-chest.c
# Opt level: O1

parser * init_parse_chest_trap(void)

{
  parser *p;
  
  p = parser_new();
  parser_setpriv(p,(void *)0x0);
  parser_reg(p,"name str name",parse_chest_trap_name);
  parser_reg(p,"code str code",parse_chest_trap_code);
  parser_reg(p,"level int level",parse_chest_trap_level);
  parser_reg(p,"effect sym eff ?sym type ?int radius ?int other",parse_chest_trap_effect);
  parser_reg(p,"dice str dice",parse_chest_trap_dice);
  parser_reg(p,"expr sym name sym base str expr",parse_chest_trap_expr);
  parser_reg(p,"destroy int val",parse_chest_trap_destroy);
  parser_reg(p,"magic int val",parse_chest_trap_magic);
  parser_reg(p,"msg str text",parse_chest_trap_msg);
  parser_reg(p,"msg-death str text",parse_chest_trap_msg_death);
  return p;
}

Assistant:

struct parser *init_parse_chest_trap(void) {
    struct parser *p = parser_new();
    parser_setpriv(p, NULL);
    parser_reg(p, "name str name", parse_chest_trap_name);
    parser_reg(p, "code str code", parse_chest_trap_code);
    parser_reg(p, "level int level", parse_chest_trap_level);
	parser_reg(p, "effect sym eff ?sym type ?int radius ?int other", parse_chest_trap_effect);
	parser_reg(p, "dice str dice", parse_chest_trap_dice);
	parser_reg(p, "expr sym name sym base str expr", parse_chest_trap_expr);
	parser_reg(p, "destroy int val", parse_chest_trap_destroy);
	parser_reg(p, "magic int val", parse_chest_trap_magic);
	parser_reg(p, "msg str text", parse_chest_trap_msg);
	parser_reg(p, "msg-death str text", parse_chest_trap_msg_death);
    return p;
}